

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O0

void __thiscall
jsoncons::
key_value<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
::key_value<char_const(&)[4]>
          (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,key_type *name,char (*args) [4])

{
  string *in_RSI;
  string *in_RDI;
  char_type *in_stack_ffffffffffffffd8;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             (semantic_tag)((ulong)in_RDI >> 0x38));
  return;
}

Assistant:

key_value(key_type&& name,  Args&& ... args) 
            : key_(std::move(name)), value_(std::forward<Args>(args)...)
        {
        }